

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

bool __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<true>_>::prepare
          (fm_operator<ymfm::opn_registers_base<true>_> *this)

{
  bool local_11;
  fm_operator<ymfm::opn_registers_base<true>_> *this_local;
  
  opn_registers_base<true>::cache_operator_data
            (this->m_regs,this->m_choffs,this->m_opoffs,&this->m_cache);
  clock_keystate(this,(uint)(this->m_keyon_live != '\0'));
  this->m_keyon_live = this->m_keyon_live & 0xfb;
  local_11 = true;
  if (this->m_env_state == EG_RELEASE) {
    local_11 = this->m_env_attenuation < 0x380;
  }
  return local_11;
}

Assistant:

bool fm_operator<RegisterType>::prepare()
{
	// cache the data
	m_regs.cache_operator_data(m_choffs, m_opoffs, m_cache);

	// clock the key state
	clock_keystate(uint32_t(m_keyon_live != 0));
	m_keyon_live &= ~(1 << KEYON_CSM);

	// we're active until we're quiet after the release
	return (m_env_state != (RegisterType::EG_HAS_REVERB ? EG_REVERB : EG_RELEASE) || m_env_attenuation < EG_QUIET);
}